

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall glslang::HlslGrammar::acceptUnaryExpression(HlslGrammar *this,TIntermTyped **node)

{
  bool bVar1;
  bool bVar2;
  EHlslTokenClass op;
  TOperator op_00;
  TFunction *function;
  TIntermTyped *pTVar3;
  TArraySizes *pTVar4;
  byte bVar5;
  TIntermNode *nodeList;
  TIntermTyped *arguments;
  TArraySizes *arraySizes;
  TSourceLoc loc;
  TSourceLoc local_f8;
  TIntermTyped *local_d8;
  TArraySizes *local_d0;
  TType local_c8;
  
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
  if (bVar1) {
    TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
    local_f8.name = (TString *)0x0;
    bVar1 = acceptType(this,&local_c8,(TIntermNode **)&local_f8);
    if (bVar1) {
      local_d0 = (TArraySizes *)0x0;
      acceptArraySpecifier(this,&local_d0);
      pTVar4 = local_d0;
      if (local_d0 != (TArraySizes *)0x0) {
        local_c8.arraySizes = local_d0;
      }
      local_f8.column = (this->super_HlslTokenStream).token.loc.column;
      local_f8._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
      local_f8.name = (this->super_HlslTokenStream).token.loc.name;
      local_f8.string = (this->super_HlslTokenStream).token.loc.string;
      local_f8.line = (this->super_HlslTokenStream).token.loc.line;
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
      if (bVar1) {
        bVar2 = acceptUnaryExpression(this,node);
        if (bVar2) {
          function = HlslParseContext::makeConstructorCall(this->parseContext,&local_f8,&local_c8);
          if (function == (TFunction *)0x0) {
            pTVar4 = (TArraySizes *)0x0;
            (*(this->parseContext->super_TParseContextBase).super_TParseVersions.
              _vptr_TParseVersions[0x2d])
                      (this->parseContext,&(this->super_HlslTokenStream).token,"Expected",
                       "type that can be constructed","");
          }
          else {
            local_d8 = (TIntermTyped *)0x0;
            HlslParseContext::handleFunctionArgument(this->parseContext,function,&local_d8,*node);
            pTVar3 = HlslParseContext::handleFunctionCall
                               (this->parseContext,&local_f8,function,local_d8);
            *node = pTVar3;
            pTVar4 = (TArraySizes *)(ulong)(pTVar3 != (TIntermTyped *)0x0);
          }
        }
        else {
          pTVar4 = (TArraySizes *)0x0;
        }
      }
      else {
        HlslTokenStream::recedeToken(&this->super_HlslTokenStream);
        HlslTokenStream::recedeToken(&this->super_HlslTokenStream);
        if (pTVar4 != (TArraySizes *)0x0) {
          (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
            [0x2d])(this->parseContext,&local_f8,"parenthesized array constructor not allowed",
                    "([]())","","");
        }
      }
      bVar5 = (byte)pTVar4;
      bVar1 = !bVar1;
    }
    else {
      HlslTokenStream::recedeToken(&this->super_HlslTokenStream);
      bVar5 = acceptPostfixExpression(this,node);
      bVar1 = false;
    }
    if (!bVar1) goto LAB_00431168;
  }
  op = HlslTokenStream::peek(&this->super_HlslTokenStream);
  op_00 = HlslOpMap::preUnary(op);
  if (op_00 == EOpNull) {
    bVar5 = acceptPostfixExpression(this,node);
  }
  else {
    local_c8.qualifier.semanticName = *(char **)&(this->super_HlslTokenStream).token.loc.column;
    local_c8._vptr_TType = (_func_int **)(this->super_HlslTokenStream).token.loc.name;
    local_c8._8_4_ = (this->super_HlslTokenStream).token.loc.string;
    local_c8._12_4_ = (this->super_HlslTokenStream).token.loc.line;
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
    bVar1 = acceptUnaryExpression(this,node);
    if (bVar1) {
      bVar5 = 1;
      if (op_00 != EOpAdd) {
        pTVar3 = TIntermediate::addUnaryMath(this->intermediate,op_00,*node,(TSourceLoc *)&local_c8)
        ;
        *node = pTVar3;
        if ((op_00 & ~EOpSequence) == EOpPreIncrement) {
          pTVar3 = HlslParseContext::handleLvalue
                             (this->parseContext,(TSourceLoc *)&local_c8,"unary operator",node);
          *node = pTVar3;
        }
        bVar5 = *node != (TIntermTyped *)0x0;
      }
    }
    else {
      bVar5 = 0;
    }
  }
LAB_00431168:
  return (bool)(bVar5 & 1);
}

Assistant:

bool HlslGrammar::acceptUnaryExpression(TIntermTyped*& node)
{
    // (type) unary_expression
    // Have to look two steps ahead, because this could be, e.g., a
    // postfix_expression instead, since that also starts with at "(".
    if (acceptTokenClass(EHTokLeftParen)) {
        TType castType;
        if (acceptType(castType)) {
            // recognize any array_specifier as part of the type
            TArraySizes* arraySizes = nullptr;
            acceptArraySpecifier(arraySizes);
            if (arraySizes != nullptr)
                castType.transferArraySizes(arraySizes);
            TSourceLoc loc = token.loc;
            if (acceptTokenClass(EHTokRightParen)) {
                // We've matched "(type)" now, get the expression to cast
                if (! acceptUnaryExpression(node))
                    return false;

                // Hook it up like a constructor
                TFunction* constructorFunction = parseContext.makeConstructorCall(loc, castType);
                if (constructorFunction == nullptr) {
                    expected("type that can be constructed");
                    return false;
                }
                TIntermTyped* arguments = nullptr;
                parseContext.handleFunctionArgument(constructorFunction, arguments, node);
                node = parseContext.handleFunctionCall(loc, constructorFunction, arguments);

                return node != nullptr;
            } else {
                // This could be a parenthesized constructor, ala (int(3)), and we just accepted
                // the '(int' part.  We must back up twice.
                recedeToken();
                recedeToken();

                // Note, there are no array constructors like
                //   (float[2](...))
                if (arraySizes != nullptr)
                    parseContext.error(loc, "parenthesized array constructor not allowed", "([]())", "", "");
            }
        } else {
            // This isn't a type cast, but it still started "(", so if it is a
            // unary expression, it can only be a postfix_expression, so try that.
            // Back it up first.
            recedeToken();
            return acceptPostfixExpression(node);
        }
    }

    // peek for "op unary_expression"
    TOperator unaryOp = HlslOpMap::preUnary(peek());

    // postfix_expression (if no unary operator)
    if (unaryOp == EOpNull)
        return acceptPostfixExpression(node);

    // op unary_expression
    TSourceLoc loc = token.loc;
    advanceToken();
    if (! acceptUnaryExpression(node))
        return false;

    // + is a no-op
    if (unaryOp == EOpAdd)
        return true;

    node = intermediate.addUnaryMath(unaryOp, node, loc);

    // These unary ops require lvalues
    if (unaryOp == EOpPreIncrement || unaryOp == EOpPreDecrement)
        node = parseContext.handleLvalue(loc, "unary operator", node);

    return node != nullptr;
}